

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

bool __thiscall
kratos::PackedStructFieldDef::same(PackedStructFieldDef *this,PackedStructFieldDef *def)

{
  PackedStruct *def_00;
  bool bVar1;
  __type_conflict2 _Var2;
  
  def_00 = def->struct_;
  if (this->struct_ == (PackedStruct *)0x0) {
    if (((def_00 == (PackedStruct *)0x0) && (_Var2 = std::operator==(&this->name,&def->name), _Var2)
        ) && (this->width == def->width)) {
      return this->signed_ == def->signed_;
    }
  }
  else if (def_00 != (PackedStruct *)0x0) {
    bVar1 = PackedStruct::same(this->struct_,def_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool PackedStructFieldDef::same(const PackedStructFieldDef &def) const {
    if (struct_ && def.struct_) {
        return struct_->same(*def.struct_);
    } else if (!struct_ && !def.struct_) {
        return name == def.name && width == def.width && signed_ == def.signed_;
    }
    return false;
}